

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_unittest.cc
# Opt level: O3

void __thiscall
google::protobuf::descriptor_unittest::MiscTest_StaticTypeNames_Test::~MiscTest_StaticTypeNames_Test
          (MiscTest_StaticTypeNames_Test *this)

{
  (this->super_MiscTest).super_Test._vptr_Test = (_func_int **)&PTR__MiscTest_01883be0;
  std::
  unique_ptr<google::protobuf::DescriptorPool,_std::default_delete<google::protobuf::DescriptorPool>_>
  ::~unique_ptr(&(this->super_MiscTest).pool_);
  testing::Test::~Test((Test *)this);
  operator_delete(this,0x18);
  return;
}

Assistant:

TEST_F(MiscTest, StaticTypeNames) {
  // Test that correct type names are returned.

  typedef FieldDescriptor FD;  // avoid ugly line wrapping

  EXPECT_EQ(absl::string_view("double"), FD::TypeName(FD::TYPE_DOUBLE));
  EXPECT_EQ(absl::string_view("float"), FD::TypeName(FD::TYPE_FLOAT));
  EXPECT_EQ(absl::string_view("int64"), FD::TypeName(FD::TYPE_INT64));
  EXPECT_EQ(absl::string_view("uint64"), FD::TypeName(FD::TYPE_UINT64));
  EXPECT_EQ(absl::string_view("int32"), FD::TypeName(FD::TYPE_INT32));
  EXPECT_EQ(absl::string_view("fixed64"), FD::TypeName(FD::TYPE_FIXED64));
  EXPECT_EQ(absl::string_view("fixed32"), FD::TypeName(FD::TYPE_FIXED32));
  EXPECT_EQ(absl::string_view("bool"), FD::TypeName(FD::TYPE_BOOL));
  EXPECT_EQ(absl::string_view("string"), FD::TypeName(FD::TYPE_STRING));
  EXPECT_EQ(absl::string_view("group"), FD::TypeName(FD::TYPE_GROUP));
  EXPECT_EQ(absl::string_view("message"), FD::TypeName(FD::TYPE_MESSAGE));
  EXPECT_EQ(absl::string_view("bytes"), FD::TypeName(FD::TYPE_BYTES));
  EXPECT_EQ(absl::string_view("uint32"), FD::TypeName(FD::TYPE_UINT32));
  EXPECT_EQ(absl::string_view("enum"), FD::TypeName(FD::TYPE_ENUM));
  EXPECT_EQ(absl::string_view("sfixed32"), FD::TypeName(FD::TYPE_SFIXED32));
  EXPECT_EQ(absl::string_view("sfixed64"), FD::TypeName(FD::TYPE_SFIXED64));
  EXPECT_EQ(absl::string_view("sint32"), FD::TypeName(FD::TYPE_SINT32));
  EXPECT_EQ(absl::string_view("sint64"), FD::TypeName(FD::TYPE_SINT64));
}